

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::on<boost::ext::ut::v1_1_8::detail::eq_<int,boost::ext::ut::v1_1_8::detail::integral_constant<0>>>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          assertion<boost::ext::ut::v1_1_8::detail::eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<0>_>_>
          assertion)

{
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<0>_>_>
  assertion_00;
  undefined6 uVar1;
  bool bVar2;
  undefined2 uStack_12;
  undefined4 uStack_4;
  
  bVar2 = true;
  if (this[0x348] ==
      (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>)0x0) {
    if (assertion.expr.value_ != true) {
      *(long *)(this + 0x210) = *(long *)(this + 0x210) + 1;
      assertion_00.location._12_4_ = uStack_4;
      assertion_00.location.line_ = assertion.location.line_;
      uVar1 = assertion.expr._0_6_;
      assertion_00.expr._6_2_ = uStack_12;
      assertion_00.expr.lhs_ = (int)uVar1;
      assertion_00.expr._4_1_ = (char)((uint6)uVar1 >> 0x20);
      assertion_00.expr.value_ = (bool)(char)((uint6)uVar1 >> 0x28);
      assertion_00.location.file_ = assertion.location.file_;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<int,boost::ext::ut::v1_1_8::detail::integral_constant<0>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,assertion_00);
    }
    else {
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    }
    bVar2 = assertion.expr.value_ == true;
  }
  return bVar2;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }